

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall
aggreports::WritePerSampleExceedanceProbabilityTable
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
          *items,int eptype,int eptype_tvar,
          map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *unusedperiodstoweighting,
          map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
          *mean_map)

{
  OASIS_FLOAT current_loss;
  double dVar1;
  pointer plVar2;
  bool bVar3;
  mapped_type *this_00;
  code *pcVar4;
  _Base_ptr p_Var5;
  long *plVar6;
  pointer plVar7;
  int counter;
  float local_104;
  OASIS_FLOAT last_computed_loss;
  double local_f0;
  double local_e8;
  double local_e0;
  size_t nextreturnperiodindex;
  int local_cc;
  undefined1 local_c8 [16];
  pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_> s;
  double last_computed_rp;
  _Base_ptr local_90;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_88;
  _Base_ptr local_80;
  _Rb_tree_node_base *local_78;
  reverse_iterator<__gnu_cxx::__normal_iterator<lossval_*,_std::vector<lossval,_std::allocator<lossval>_>_>_>
  local_70;
  reverse_iterator<__gnu_cxx::__normal_iterator<lossval_*,_std::vector<lossval,_std::allocator<lossval>_>_>_>
  local_68;
  map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
  tail;
  
  if ((items->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    tail._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &tail._M_t._M_impl.super__Rb_tree_header._M_header;
    tail._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    tail._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    tail._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_90 = &(items->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_78 = &(unusedperiodstoweighting->_M_t)._M_impl.super__Rb_tree_header._M_header;
    p_Var5 = (items->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_cc = eptype_tvar;
    local_88 = unusedperiodstoweighting;
    tail._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         tail._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (p_Var5 != local_90) {
      std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>::pair
                (&s,(pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_> *)
                    (p_Var5 + 1));
      local_68.current._M_current =
           (__normal_iterator<lossval_*,_std::vector<lossval,_std::allocator<lossval>_>_>)
           (__normal_iterator<lossval_*,_std::vector<lossval,_std::allocator<lossval>_>_>)
           s.second.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_70.current._M_current =
           (__normal_iterator<lossval_*,_std::vector<lossval,_std::allocator<lossval>_>_>)
           (__normal_iterator<lossval_*,_std::vector<lossval,_std::allocator<lossval>_>_>)
           s.second.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_80 = p_Var5;
      std::
      sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<lossval*,std::vector<lossval,std::allocator<lossval>>>>>
                (&local_68,&local_70);
      plVar2 = s.second.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
               super__Vector_impl_data._M_finish;
      nextreturnperiodindex = 0;
      last_computed_rp = 0.0;
      last_computed_loss = 0.0;
      local_104 = 0.0;
      local_e8 = 0.0;
      bVar3 = false;
      local_f0 = 0.0;
      counter = 1;
      for (plVar7 = s.second.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
                    super__Vector_impl_data._M_start; plVar7 != plVar2; plVar7 = plVar7 + 1) {
        dVar1 = plVar7->period_weighting;
        local_f0 = local_f0 + (double)((float)this->samplesize_ * (float)dVar1);
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          local_e0 = 1.0 / local_f0;
          if (!bVar3) {
            local_e8 = local_e0 + 0.0001;
          }
          current_loss = plVar7->value;
          if (this->useReturnPeriodFile_ == true) {
            local_c8._0_8_ = this->WritePSEPTOutput;
            local_c8._8_8_ = *(undefined8 *)&this->field_0x168;
            WriteReturnPeriodOut<std::map<wheatkey,std::vector<TVaR,std::allocator<TVaR>>,std::less<wheatkey>,std::allocator<std::pair<wheatkey_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                      (this,fileIDs,&nextreturnperiodindex,&last_computed_rp,&last_computed_loss,
                       local_e0,current_loss,s.first.summary_id,eptype,s.first.sidx,local_e8,counter
                       ,local_104,&tail,local_c8._0_8_,
                       (map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                        *)local_c8._8_8_);
            local_104 = local_104 - (local_104 - current_loss) / (float)counter;
          }
          else {
            this_00 = std::
                      map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                      ::operator[](&tail,&s.first);
            local_104 = local_104 - (local_104 - current_loss) / (float)counter;
            local_c8._0_8_ = local_e0;
            local_c8._8_4_ = local_104;
            std::vector<TVaR,_std::allocator<TVaR>_>::emplace_back<TVaR>(this_00,(TVaR *)local_c8);
            pcVar4 = (code *)this->WritePSEPTOutput;
            if (pcVar4 != (code *)0x0) {
              plVar6 = (long *)((long)&this->totalperiods_ + *(long *)&this->field_0x168);
              if (((ulong)pcVar4 & 1) != 0) {
                pcVar4 = *(code **)(pcVar4 + *plVar6 + -1);
              }
              (*pcVar4)(SUB84(local_e0,0),current_loss,plVar6,fileIDs,s.first.summary_id,
                        s.first.sidx,eptype);
            }
          }
          counter = counter + 1;
          bVar3 = true;
        }
      }
      if (this->useReturnPeriodFile_ != false) {
        p_Var5 = (local_88->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          if (p_Var5 == local_78) {
            dVar1 = 0.0;
          }
          else {
            local_f0 = local_f0 + (double)this->samplesize_ * (double)p_Var5[1]._M_parent;
            dVar1 = 1.0 / local_f0;
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
          }
          local_c8._0_8_ = this->WritePSEPTOutput;
          local_c8._8_8_ = *(undefined8 *)&this->field_0x168;
          WriteReturnPeriodOut<std::map<wheatkey,std::vector<TVaR,std::allocator<TVaR>>,std::less<wheatkey>,std::allocator<std::pair<wheatkey_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                    (this,fileIDs,&nextreturnperiodindex,&last_computed_rp,&last_computed_loss,dVar1
                     ,0.0,s.first.summary_id,eptype,s.first.sidx,local_e8,counter,local_104,&tail,
                     local_c8._0_8_,
                     (map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                      *)local_c8._8_8_);
          local_104 = local_104 - local_104 / (float)counter;
          counter = counter + 1;
        } while (nextreturnperiodindex <
                 (ulong)((long)(this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2));
      }
      std::_Vector_base<lossval,_std::allocator<lossval>_>::~_Vector_base
                (&s.second.super__Vector_base<lossval,_std::allocator<lossval>_>);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(local_80);
    }
    if ((this->ordFlag_ != false) && (this->fout_[1] != (FILE *)0x0)) {
      WriteTVaR(this,fileIDs,local_cc,&tail);
    }
    std::
    _Rb_tree<wheatkey,_std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>,_std::_Select1st<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
    ::~_Rb_tree(&tail._M_t);
  }
  return;
}

Assistant:

void aggreports::WritePerSampleExceedanceProbabilityTable(
	const std::vector<int> &fileIDs, std::map<wheatkey, lossvec2> &items,
	int eptype, int eptype_tvar,
	std::map<int, double> &unusedperiodstoweighting,
	std::map<int, std::vector<mean_count>> *mean_map) {

  if (items.size() == 0) return;

#ifdef ORD_OUTPUT
  if (os_psept_exists_ == false) {
  	if (parquetFileNames_[PSEPT] != "") {
		os_psept_ = GetParquetStreamWriter(PSEPT);
		os_psept_exists_ = true;
	}
  }
#endif

  std::map<wheatkey, std::vector<TVaR>> tail;

  for (auto s : items) {
    lossvec2 &lpv = s.second;
    std::sort(lpv.rbegin(), lpv.rend());
    size_t nextreturnperiodindex = 0;
    double last_computed_rp = 0;
    OASIS_FLOAT last_computed_loss = 0;
    OASIS_FLOAT tvar = 0;
    int i = 1;
    double cumulative_weighting = 0;
    double max_retperiod = 0;
    bool largest_loss = false;

    for (auto lp : lpv) {
      cumulative_weighting += (OASIS_FLOAT)lp.period_weighting * samplesize_;

      if (lp.period_weighting) {
	double retperiod = 1 / cumulative_weighting;

	if (!largest_loss) {
	  max_retperiod = retperiod + 0.0001;   // Add for floating point errors
	  largest_loss = true;
	}

	if (useReturnPeriodFile_) {
#ifdef ORD_OUTPUT
	  WriteReturnPeriodOut(fileIDs, nextreturnperiodindex,
			       last_computed_rp, last_computed_loss, retperiod,
			       lp.value, s.first.summary_id, eptype,
			       s.first.sidx, max_retperiod, i, tvar, tail,
			       WritePSEPTOutput, os_psept_, mean_map);
#else
	  WriteReturnPeriodOut(fileIDs, nextreturnperiodindex,
			       last_computed_rp, last_computed_loss, retperiod,
			       lp.value, s.first.summary_id, eptype,
			       s.first.sidx, max_retperiod, i, tvar, tail,
			       WritePSEPTOutput, mean_map);
#endif
	  tvar = tvar - ((tvar - lp.value) / i);
	} else {
	  tvar = tvar - ((tvar - lp.value) / i);
	  tail[s.first].push_back({retperiod, tvar});
	  if (WritePSEPTOutput != nullptr) {
	    (this->*WritePSEPTOutput)(fileIDs, s.first.summary_id, s.first.sidx,
				      eptype, retperiod, lp.value);
	  }
#ifdef ORD_OUTPUT
	// TODO: Rather than checking for this on every iteration, it may be
	// more efficient to create a new class that inherits from
	// parquet::StreamWriter and implement the ios::setstate() function. In
	// this way, the state can be set to std::ios_base::badbit if needed.
	  if (parquetFileNames_[PSEPT] != "") {
	    WriteParquetOutput(os_psept_, s.first.summary_id, s.first.sidx,
			       eptype, retperiod, lp.value);
	  }
#endif
	}
	i++;
      }
    }
    if (useReturnPeriodFile_) {
      auto iter = unusedperiodstoweighting.begin();
      do {
	double retperiod = 0;
	if (iter != unusedperiodstoweighting.end()) {
	  cumulative_weighting += (iter->second * samplesize_);
	  retperiod = 1 / cumulative_weighting;
	  ++iter;
	}
#ifdef ORD_OUTPUT
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0,
			     s.first.summary_id, eptype, s.first.sidx,
			     max_retperiod, i, tvar, tail, WritePSEPTOutput,
			     os_psept_, mean_map);
#else
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0,
			     s.first.summary_id, eptype, s.first.sidx,
			     max_retperiod, i, tvar, tail, WritePSEPTOutput,
			     mean_map);
#endif
	tvar = tvar - (tvar / i);
	i++;
      } while (nextreturnperiodindex < returnperiods_.size());
    }
  }

  // Only write Tail Value at Risk (TVaR) for ORD output
  if (!ordFlag_) return;
  if (fout_[PSEPT] != nullptr) WriteTVaR(fileIDs, eptype_tvar, tail);
#ifdef ORD_OUTPUT
  if (parquetFileNames_[PSEPT] != "") WriteTVaR(os_psept_, eptype_tvar, tail);
#endif

}